

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::
Recycled<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::Recycled(Recycled<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           *this)

{
  unique_ptr<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
  *puVar1;
  default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>
  *this_00;
  Stack<std::unique_ptr<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>_>
  *pSVar2;
  _Head_base<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_false>
  this_01;
  pointer *__ptr;
  
  pSVar2 = mem();
  if (pSVar2->_cursor == pSVar2->_stack) {
    this_01._M_head_impl =
         (Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
          *)::operator_new(0x20);
    (this_01._M_head_impl)->_capacity = 0;
    (this_01._M_head_impl)->_noOfEntries = 0;
    (this_01._M_head_impl)->_entries = (Entry *)0x0;
    Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
    ::expand(this_01._M_head_impl);
    (this->_self)._M_t.
    super___uniq_ptr_impl<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
    .
    super__Head_base<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_false>
    ._M_head_impl = this_01._M_head_impl;
  }
  else {
    pSVar2 = mem();
    puVar1 = pSVar2->_cursor;
    pSVar2->_cursor = puVar1 + -1;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
    .
    super__Head_base<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_false>
    ._M_head_impl =
         puVar1[-1]._M_t.
         super___uniq_ptr_impl<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
         .
         super__Head_base<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_false>
         ._M_head_impl;
    puVar1[-1]._M_t.
    super___uniq_ptr_impl<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_std::default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>_>
    .
    super__Head_base<0UL,_Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_*,_false>
    ._M_head_impl =
         (Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
          *)0x0;
    this_00 = (default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>
               *)pSVar2->_cursor;
    if (*(Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
          **)this_00 !=
        (Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
         *)0x0) {
      std::
      default_delete<Lib::Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>_>
      ::operator()(this_00,*(Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
                             **)this_00);
    }
    *(undefined8 *)this_00 = 0;
  }
  return;
}

Assistant:

Recycled()
    : _self(mem().isNonEmpty() ? mem().pop() : IF_USE_PTRS(std::make_unique<T>(), T()))
  { }